

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

Matrix * rw::Matrix::transpose(Matrix *dst,Matrix *src)

{
  Matrix *src_local;
  Matrix *dst_local;
  
  if ((src->flags & 0x20000) != 0) {
    memcpy(dst,src,0x40);
  }
  (dst->right).x = (src->right).x;
  (dst->up).x = (src->right).y;
  (dst->at).x = (src->right).z;
  (dst->right).y = (src->up).x;
  (dst->up).y = (src->up).y;
  (dst->at).y = (src->up).z;
  (dst->right).z = (src->at).x;
  (dst->up).z = (src->at).y;
  (dst->at).z = (src->at).z;
  (dst->pos).x = 0.0;
  (dst->pos).y = 0.0;
  (dst->pos).z = 0.0;
  return dst;
}

Assistant:

Matrix*
Matrix::transpose(Matrix *dst, const Matrix *src)
{
	if(src->flags & IDENTITY)
		*dst = *src;
	dst->right.x = src->right.x;
	dst->up.x = src->right.y;
	dst->at.x = src->right.z;
	dst->right.y = src->up.x;
	dst->up.y = src->up.y;
	dst->at.y = src->up.z;
	dst->right.z = src->at.x;
	dst->up.z = src->at.y;
	dst->at.z = src->at.z;
	dst->pos.x = 0.0;
	dst->pos.y = 0.0;
	dst->pos.z = 0.0;
	return dst;
}